

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_codestream_index_t * j2k_get_cstr_index(opj_j2k_t *p_j2k)

{
  OPJ_BYTE *pOVar1;
  void *pvVar2;
  uint local_2c;
  uint local_28;
  OPJ_UINT32 it_tile_free_1;
  OPJ_UINT32 it_tile_free;
  OPJ_UINT32 it_tile;
  opj_codestream_index_t *l_cstr_index;
  opj_j2k_t *p_j2k_local;
  
  p_j2k_local = (opj_j2k_t *)opj_calloc(1,0x38);
  if (p_j2k_local == (opj_j2k_t *)0x0) {
    p_j2k_local = (opj_j2k_t *)0x0;
  }
  else {
    *(OPJ_OFF_T *)p_j2k_local = p_j2k->cstr_index->main_head_start;
    *(OPJ_OFF_T *)&p_j2k_local->m_specific_param = p_j2k->cstr_index->main_head_end;
    (p_j2k_local->m_specific_param).m_decoder.m_default_tcp =
         (opj_tcp_t *)p_j2k->cstr_index->codestream_size;
    *(OPJ_UINT32 *)((long)&p_j2k_local->m_specific_param + 0x10) = p_j2k->cstr_index->marknum;
    pOVar1 = (OPJ_BYTE *)
             opj_malloc((ulong)*(uint *)((long)&p_j2k_local->m_specific_param + 0x10) * 0x18);
    (p_j2k_local->m_specific_param).m_encoder.m_tlm_sot_offsets_current = pOVar1;
    if ((p_j2k_local->m_specific_param).m_encoder.m_tlm_sot_offsets_current == (OPJ_BYTE *)0x0) {
      opj_free(p_j2k_local);
      p_j2k_local = (opj_j2k_t *)0x0;
    }
    else {
      if (p_j2k->cstr_index->marker == (opj_marker_info_t *)0x0) {
        opj_free((p_j2k_local->m_specific_param).m_encoder.m_tlm_sot_offsets_current);
        (p_j2k_local->m_specific_param).m_encoder.m_tlm_sot_offsets_current = (OPJ_BYTE *)0x0;
      }
      else {
        memcpy((p_j2k_local->m_specific_param).m_encoder.m_tlm_sot_offsets_current,
               p_j2k->cstr_index->marker,
               (ulong)*(uint *)((long)&p_j2k_local->m_specific_param + 0x10) * 0x18);
      }
      (p_j2k_local->m_specific_param).m_decoder.m_start_tile_y = p_j2k->cstr_index->nb_of_tiles;
      pOVar1 = (OPJ_BYTE *)
               opj_calloc((ulong)(p_j2k_local->m_specific_param).m_decoder.m_start_tile_y,0x38);
      (p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data = pOVar1;
      if ((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k_local->m_specific_param).m_encoder.m_tlm_sot_offsets_current);
        opj_free(p_j2k_local);
        p_j2k_local = (opj_j2k_t *)0x0;
      }
      else if (p_j2k->cstr_index->tile_index == (opj_tile_index_t *)0x0) {
        opj_free((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data);
        (p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data = (OPJ_BYTE *)0x0;
      }
      else {
        for (it_tile_free_1 = 0;
            it_tile_free_1 < (p_j2k_local->m_specific_param).m_decoder.m_start_tile_y;
            it_tile_free_1 = it_tile_free_1 + 1) {
          *(OPJ_UINT32 *)
           ((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
           (ulong)it_tile_free_1 * 0x38 + 0x18) =
               p_j2k->cstr_index->tile_index[it_tile_free_1].marknum;
          pvVar2 = opj_malloc((ulong)*(uint *)((p_j2k_local->m_specific_param).m_encoder.
                                               m_encoded_tile_data +
                                              (ulong)it_tile_free_1 * 0x38 + 0x18) * 0x18);
          *(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                    (ulong)it_tile_free_1 * 0x38 + 0x20) = pvVar2;
          if (*(long *)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                       (ulong)it_tile_free_1 * 0x38 + 0x20) == 0) {
            for (local_28 = 0; local_28 < it_tile_free_1; local_28 = local_28 + 1) {
              opj_free(*(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                                 (ulong)local_28 * 0x38 + 0x20));
            }
            opj_free((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data);
            opj_free((p_j2k_local->m_specific_param).m_encoder.m_tlm_sot_offsets_current);
            opj_free(p_j2k_local);
            return (opj_codestream_index_t *)0x0;
          }
          if (p_j2k->cstr_index->tile_index[it_tile_free_1].marker == (opj_marker_info_t *)0x0) {
            opj_free(*(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                               (ulong)it_tile_free_1 * 0x38 + 0x20));
            pOVar1 = (p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                     (ulong)it_tile_free_1 * 0x38 + 0x20;
            pOVar1[0] = '\0';
            pOVar1[1] = '\0';
            pOVar1[2] = '\0';
            pOVar1[3] = '\0';
            pOVar1[4] = '\0';
            pOVar1[5] = '\0';
            pOVar1[6] = '\0';
            pOVar1[7] = '\0';
          }
          else {
            memcpy(*(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                             (ulong)it_tile_free_1 * 0x38 + 0x20),
                   p_j2k->cstr_index->tile_index[it_tile_free_1].marker,
                   (ulong)*(uint *)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                                   (ulong)it_tile_free_1 * 0x38 + 0x18) * 0x18);
          }
          *(OPJ_UINT32 *)
           ((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
           (ulong)it_tile_free_1 * 0x38 + 4) = p_j2k->cstr_index->tile_index[it_tile_free_1].nb_tps;
          pvVar2 = opj_malloc((ulong)*(uint *)((p_j2k_local->m_specific_param).m_encoder.
                                               m_encoded_tile_data +
                                              (ulong)it_tile_free_1 * 0x38 + 4) * 0x18);
          *(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                    (ulong)it_tile_free_1 * 0x38 + 0x10) = pvVar2;
          if (*(long *)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                       (ulong)it_tile_free_1 * 0x38 + 0x10) == 0) {
            for (local_2c = 0; local_2c < it_tile_free_1; local_2c = local_2c + 1) {
              opj_free(*(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                                 (ulong)local_2c * 0x38 + 0x20));
              opj_free(*(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                                 (ulong)local_2c * 0x38 + 0x10));
            }
            opj_free((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data);
            opj_free((p_j2k_local->m_specific_param).m_encoder.m_tlm_sot_offsets_current);
            opj_free(p_j2k_local);
            return (opj_codestream_index_t *)0x0;
          }
          if (p_j2k->cstr_index->tile_index[it_tile_free_1].tp_index == (opj_tp_index_t *)0x0) {
            opj_free(*(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                               (ulong)it_tile_free_1 * 0x38 + 0x10));
            pOVar1 = (p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                     (ulong)it_tile_free_1 * 0x38 + 0x10;
            pOVar1[0] = '\0';
            pOVar1[1] = '\0';
            pOVar1[2] = '\0';
            pOVar1[3] = '\0';
            pOVar1[4] = '\0';
            pOVar1[5] = '\0';
            pOVar1[6] = '\0';
            pOVar1[7] = '\0';
          }
          else {
            memcpy(*(void **)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                             (ulong)it_tile_free_1 * 0x38 + 0x10),
                   p_j2k->cstr_index->tile_index[it_tile_free_1].tp_index,
                   (ulong)*(uint *)((p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                                   (ulong)it_tile_free_1 * 0x38 + 4) * 0x18);
          }
          pOVar1 = (p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                   (ulong)it_tile_free_1 * 0x38 + 0x2c;
          pOVar1[0] = '\0';
          pOVar1[1] = '\0';
          pOVar1[2] = '\0';
          pOVar1[3] = '\0';
          pOVar1 = (p_j2k_local->m_specific_param).m_encoder.m_encoded_tile_data +
                   (ulong)it_tile_free_1 * 0x38 + 0x30;
          pOVar1[0] = '\0';
          pOVar1[1] = '\0';
          pOVar1[2] = '\0';
          pOVar1[3] = '\0';
          pOVar1[4] = '\0';
          pOVar1[5] = '\0';
          pOVar1[6] = '\0';
          pOVar1[7] = '\0';
        }
      }
    }
  }
  return (opj_codestream_index_t *)p_j2k_local;
}

Assistant:

opj_codestream_index_t* j2k_get_cstr_index(opj_j2k_t* p_j2k)
{
    opj_codestream_index_t* l_cstr_index = (opj_codestream_index_t*)
                                           opj_calloc(1, sizeof(opj_codestream_index_t));
    if (!l_cstr_index) {
        return NULL;
    }

    l_cstr_index->main_head_start = p_j2k->cstr_index->main_head_start;
    l_cstr_index->main_head_end = p_j2k->cstr_index->main_head_end;
    l_cstr_index->codestream_size = p_j2k->cstr_index->codestream_size;

    l_cstr_index->marknum = p_j2k->cstr_index->marknum;
    l_cstr_index->marker = (opj_marker_info_t*)opj_malloc(l_cstr_index->marknum *
                           sizeof(opj_marker_info_t));
    if (!l_cstr_index->marker) {
        opj_free(l_cstr_index);
        return NULL;
    }

    if (p_j2k->cstr_index->marker) {
        memcpy(l_cstr_index->marker, p_j2k->cstr_index->marker,
               l_cstr_index->marknum * sizeof(opj_marker_info_t));
    } else {
        opj_free(l_cstr_index->marker);
        l_cstr_index->marker = NULL;
    }

    l_cstr_index->nb_of_tiles = p_j2k->cstr_index->nb_of_tiles;
    l_cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(
                                   l_cstr_index->nb_of_tiles, sizeof(opj_tile_index_t));
    if (!l_cstr_index->tile_index) {
        opj_free(l_cstr_index->marker);
        opj_free(l_cstr_index);
        return NULL;
    }

    if (!p_j2k->cstr_index->tile_index) {
        opj_free(l_cstr_index->tile_index);
        l_cstr_index->tile_index = NULL;
    } else {
        OPJ_UINT32 it_tile = 0;
        for (it_tile = 0; it_tile < l_cstr_index->nb_of_tiles; it_tile++) {

            /* Tile Marker*/
            l_cstr_index->tile_index[it_tile].marknum =
                p_j2k->cstr_index->tile_index[it_tile].marknum;

            l_cstr_index->tile_index[it_tile].marker =
                (opj_marker_info_t*)opj_malloc(l_cstr_index->tile_index[it_tile].marknum *
                                               sizeof(opj_marker_info_t));

            if (!l_cstr_index->tile_index[it_tile].marker) {
                OPJ_UINT32 it_tile_free;

                for (it_tile_free = 0; it_tile_free < it_tile; it_tile_free++) {
                    opj_free(l_cstr_index->tile_index[it_tile_free].marker);
                }

                opj_free(l_cstr_index->tile_index);
                opj_free(l_cstr_index->marker);
                opj_free(l_cstr_index);
                return NULL;
            }

            if (p_j2k->cstr_index->tile_index[it_tile].marker)
                memcpy(l_cstr_index->tile_index[it_tile].marker,
                       p_j2k->cstr_index->tile_index[it_tile].marker,
                       l_cstr_index->tile_index[it_tile].marknum * sizeof(opj_marker_info_t));
            else {
                opj_free(l_cstr_index->tile_index[it_tile].marker);
                l_cstr_index->tile_index[it_tile].marker = NULL;
            }

            /* Tile part index*/
            l_cstr_index->tile_index[it_tile].nb_tps =
                p_j2k->cstr_index->tile_index[it_tile].nb_tps;

            l_cstr_index->tile_index[it_tile].tp_index =
                (opj_tp_index_t*)opj_malloc(l_cstr_index->tile_index[it_tile].nb_tps * sizeof(
                                                opj_tp_index_t));

            if (!l_cstr_index->tile_index[it_tile].tp_index) {
                OPJ_UINT32 it_tile_free;

                for (it_tile_free = 0; it_tile_free < it_tile; it_tile_free++) {
                    opj_free(l_cstr_index->tile_index[it_tile_free].marker);
                    opj_free(l_cstr_index->tile_index[it_tile_free].tp_index);
                }

                opj_free(l_cstr_index->tile_index);
                opj_free(l_cstr_index->marker);
                opj_free(l_cstr_index);
                return NULL;
            }

            if (p_j2k->cstr_index->tile_index[it_tile].tp_index) {
                memcpy(l_cstr_index->tile_index[it_tile].tp_index,
                       p_j2k->cstr_index->tile_index[it_tile].tp_index,
                       l_cstr_index->tile_index[it_tile].nb_tps * sizeof(opj_tp_index_t));
            } else {
                opj_free(l_cstr_index->tile_index[it_tile].tp_index);
                l_cstr_index->tile_index[it_tile].tp_index = NULL;
            }

            /* Packet index (NOT USED)*/
            l_cstr_index->tile_index[it_tile].nb_packet = 0;
            l_cstr_index->tile_index[it_tile].packet_index = NULL;

        }
    }

    return l_cstr_index;
}